

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_initCDict_internal
                 (ZSTD_CDict *cdict,void *dictBuffer,size_t dictSize,
                 ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
                 ZSTD_CCtx_params params)

{
  ZSTD_cwksp *ws;
  undefined8 uVar1;
  size_t err_code;
  void *__dest;
  U32 *pUVar2;
  size_t sVar3;
  
  uVar1 = params.cParams._8_8_;
  (cdict->matchState).cParams.searchLog = (int)params.cParams._12_8_;
  (cdict->matchState).cParams.minMatch = (int)((ulong)params.cParams._12_8_ >> 0x20);
  (cdict->matchState).cParams.targetLength = params.cParams.targetLength;
  (cdict->matchState).cParams.strategy = params.cParams.strategy;
  (cdict->matchState).cParams.windowLog = params.cParams.windowLog;
  (cdict->matchState).cParams.chainLog = params.cParams.chainLog;
  (cdict->matchState).cParams.hashLog = (int)uVar1;
  (cdict->matchState).cParams.searchLog = (int)((ulong)uVar1 >> 0x20);
  (cdict->matchState).dedicatedDictSearch = params.enableDedicatedDictSearch;
  if (((dictSize == 0) || (dictBuffer == (void *)0x0)) || (dictLoadMethod == ZSTD_dlm_byRef)) {
    cdict->dictContent = dictBuffer;
  }
  else {
    __dest = ZSTD_cwksp_reserve_object(&cdict->workspace,dictSize + 7 & 0xfffffffffffffff8);
    if (__dest == (void *)0x0) {
      return 0xffffffffffffffc0;
    }
    cdict->dictContent = __dest;
    switchD_00916250::default(__dest,dictBuffer,dictSize);
  }
  cdict->dictContentSize = dictSize;
  cdict->dictContentType = dictContentType;
  ws = &cdict->workspace;
  pUVar2 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x2200);
  cdict->entropyWorkspace = pUVar2;
  ZSTD_reset_compressedBlockState(&cdict->cBlockState);
  sVar3 = ZSTD_reset_matchState
                    (&cdict->matchState,ws,&params.cParams,params.useRowMatchFinder,
                     ZSTDcrp_makeClean,ZSTDirp_reset,ZSTD_resetTarget_CDict);
  if (sVar3 < 0xffffffffffffff89) {
    params.compressionLevel = 3;
    params.fParams.contentSizeFlag = 1;
    sVar3 = ZSTD_compress_insertDictionary
                      (&cdict->cBlockState,&cdict->matchState,(ldmState_t *)0x0,ws,&params,
                       cdict->dictContent,cdict->dictContentSize,dictContentType,ZSTD_dtlm_full,
                       ZSTD_tfp_forCDict,cdict->entropyWorkspace);
    if (sVar3 < 0xffffffffffffff89) {
      cdict->dictID = (U32)sVar3;
      sVar3 = 0;
    }
  }
  return sVar3;
}

Assistant:

static size_t ZSTD_initCDict_internal(
                    ZSTD_CDict* cdict,
              const void* dictBuffer, size_t dictSize,
                    ZSTD_dictLoadMethod_e dictLoadMethod,
                    ZSTD_dictContentType_e dictContentType,
                    ZSTD_CCtx_params params)
{
    DEBUGLOG(3, "ZSTD_initCDict_internal (dictContentType:%u)", (unsigned)dictContentType);
    assert(!ZSTD_checkCParams(params.cParams));
    cdict->matchState.cParams = params.cParams;
    cdict->matchState.dedicatedDictSearch = params.enableDedicatedDictSearch;
    if ((dictLoadMethod == ZSTD_dlm_byRef) || (!dictBuffer) || (!dictSize)) {
        cdict->dictContent = dictBuffer;
    } else {
         void *internalBuffer = ZSTD_cwksp_reserve_object(&cdict->workspace, ZSTD_cwksp_align(dictSize, sizeof(void*)));
        RETURN_ERROR_IF(!internalBuffer, memory_allocation, "NULL pointer!");
        cdict->dictContent = internalBuffer;
        ZSTD_memcpy(internalBuffer, dictBuffer, dictSize);
    }
    cdict->dictContentSize = dictSize;
    cdict->dictContentType = dictContentType;

    cdict->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cdict->workspace, HUF_WORKSPACE_SIZE);


    /* Reset the state to no dictionary */
    ZSTD_reset_compressedBlockState(&cdict->cBlockState);
    FORWARD_IF_ERROR(ZSTD_reset_matchState(
        &cdict->matchState,
        &cdict->workspace,
        &params.cParams,
        params.useRowMatchFinder,
        ZSTDcrp_makeClean,
        ZSTDirp_reset,
        ZSTD_resetTarget_CDict), "");
    /* (Maybe) load the dictionary
     * Skips loading the dictionary if it is < 8 bytes.
     */
    {   params.compressionLevel = ZSTD_CLEVEL_DEFAULT;
        params.fParams.contentSizeFlag = 1;
        {   size_t const dictID = ZSTD_compress_insertDictionary(
                    &cdict->cBlockState, &cdict->matchState, NULL, &cdict->workspace,
                    &params, cdict->dictContent, cdict->dictContentSize,
                    dictContentType, ZSTD_dtlm_full, ZSTD_tfp_forCDict, cdict->entropyWorkspace);
            FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
            assert(dictID <= (size_t)(U32)-1);
            cdict->dictID = (U32)dictID;
        }
    }

    return 0;
}